

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_invokespecial(ExecutionEngine *this)

{
  char cVar1;
  u2 index;
  cp_info *constantPool;
  anon_union_8_10_52016fac_for_data object;
  bool bVar2;
  int iVar3;
  VMStack *this_00;
  Frame *this_01;
  cp_info **ppcVar4;
  u1 *puVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  MethodArea *this_02;
  ClassRuntime *classRuntime;
  Frame *this_03;
  Frame *pFVar9;
  ostream *poVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  Value objectValue;
  vector<Value,_std::allocator<Value>_> args;
  string className;
  string methodName;
  string methodDescriptor;
  _Vector_base<Value,_std::allocator<Value>_> local_128;
  string local_110;
  string local_f0;
  _Deque_base<Value,_std::allocator<Value>_> local_d0;
  stack<Value,_std::deque<Value,_std::allocator<Value>_>_> operandStackBackup;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  Frame::backupOperandStack(&operandStackBackup,this_01);
  ppcVar4 = Frame::getConstantPool(this_01);
  constantPool = *ppcVar4;
  puVar5 = Frame::getCode(this_01,this_01->pc);
  uVar6 = (ulong)(ushort)(*(ushort *)(puVar5 + 1) << 8 | *(ushort *)(puVar5 + 1) >> 8);
  if (constantPool[uVar6 - 1].tag != '\n') {
    __assert_fail("methodCP.tag == CONSTANT_Methodref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfad,"void ExecutionEngine::i_invokespecial()");
  }
  uVar13 = (ulong)constantPool[uVar6 - 1].info.fieldref_info.name_and_type_index;
  pcVar7 = getFormattedConstant(constantPool,constantPool[uVar6 - 1].info.fieldref_info.class_index)
  ;
  std::__cxx11::string::string((string *)&className,pcVar7,(allocator *)&methodName);
  if (constantPool[uVar13 - 1].tag != '\f') {
    __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfb4,"void ExecutionEngine::i_invokespecial()");
  }
  index = constantPool[uVar13 - 1].info.fieldref_info.name_and_type_index;
  pcVar7 = getFormattedConstant
                     (constantPool,constantPool[uVar13 - 1].info.fieldref_info.class_index);
  std::__cxx11::string::string((string *)&methodName,pcVar7,(allocator *)&methodDescriptor);
  pcVar7 = getFormattedConstant(constantPool,index);
  std::__cxx11::string::string((string *)&methodDescriptor,pcVar7,(allocator *)&args);
  bVar2 = std::operator==(&className,"java/lang/Object");
  if (((!bVar2) && (bVar2 = std::operator==(&className,"java/lang/String"), !bVar2)) ||
     (bVar2 = std::operator==(&methodName,"<init>"), !bVar2)) {
    lVar8 = std::__cxx11::string::find((char *)&className,0x129561);
    if (lVar8 != -1) {
      poVar10 = std::operator<<((ostream *)&std::cerr,"Tentando invocar metodo especial invalido: ")
      ;
      poVar10 = std::operator<<(poVar10,(string *)&methodName);
      std::endl<char,std::char_traits<char>>(poVar10);
      exit(1);
    }
    uVar11 = 1;
    uVar12 = 0;
    do {
      cVar1 = methodDescriptor._M_dataplus._M_p[uVar11];
      if ((cVar1 == 'D') || (cVar1 == 'J')) {
        uVar12 = uVar12 + 2;
      }
      else {
        if (cVar1 == 'L') {
          do {
            uVar11 = uVar11 + 1;
          } while (methodDescriptor._M_dataplus._M_p[uVar11] != ';');
        }
        else {
          if (cVar1 == '[') {
            uVar12 = uVar12 + 1;
            do {
              uVar11 = uVar11 + 1;
            } while (methodDescriptor._M_dataplus._M_p[uVar11] == '[');
            if (methodDescriptor._M_dataplus._M_p[uVar11] == 'L') {
              do {
                uVar11 = uVar11 + 1;
              } while (methodDescriptor._M_dataplus._M_p[uVar11] != ';');
            }
            goto LAB_0012200f;
          }
          if (cVar1 == ')') goto LAB_00122035;
        }
        uVar12 = uVar12 + 1;
      }
LAB_0012200f:
      uVar11 = uVar11 + 1;
    } while( true );
  }
  bVar2 = std::operator==(&className,"java/lang/String");
  if (bVar2) {
    Frame::popTopOfOperandStack(this_01);
  }
LAB_0012220e:
  this_01->pc = this_01->pc + 3;
LAB_00122211:
  std::__cxx11::string::~string((string *)&methodDescriptor);
  std::__cxx11::string::~string((string *)&methodName);
  std::__cxx11::string::~string((string *)&className);
  std::_Deque_base<Value,_std::allocator<Value>_>::~_Deque_base
            ((_Deque_base<Value,_std::allocator<Value>_> *)&operandStackBackup);
  return;
LAB_00122035:
  args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  uVar12 = uVar12 & 0xffff;
  while (bVar2 = uVar12 != 0, uVar12 = uVar12 - 1, bVar2) {
    objectValue = Frame::popTopOfOperandStack(this_01);
    if ((objectValue._0_8_ & 0xffffffff00000000) == 0xa00000000) {
      std::vector<Value,_std::allocator<Value>_>::insert
                (&args,args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                       super__Vector_impl_data._M_start + 1,&objectValue);
    }
    else {
      std::vector<Value,_std::allocator<Value>_>::insert
                (&args,(const_iterator)
                       args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                       super__Vector_impl_data._M_start,&objectValue);
    }
  }
  objectValue = Frame::popTopOfOperandStack(this_01);
  if ((objectValue._0_8_ & 0xffffffff00000000) != 0x900000000) {
    __assert_fail("objectValue.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfe8,"void ExecutionEngine::i_invokespecial()");
  }
  std::vector<Value,_std::allocator<Value>_>::insert
            (&args,(const_iterator)
                   args.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                   super__Vector_impl_data._M_start,&objectValue);
  object.longValue = objectValue.data.longValue;
  iVar3 = (**(objectValue.data.object)->_vptr_Object)(objectValue.data.longValue);
  if (iVar3 != 0) {
    __assert_fail("object->objectType() == ObjectType::CLASS_INSTANCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xfec,"void ExecutionEngine::i_invokespecial()");
  }
  this_02 = MethodArea::getInstance();
  classRuntime = MethodArea::loadClassNamed(this_02,&className);
  this_03 = (Frame *)operator_new(0xb8);
  std::__cxx11::string::string((string *)&local_f0,(string *)&methodName);
  std::__cxx11::string::string((string *)&local_110,(string *)&methodDescriptor);
  std::vector<Value,_std::allocator<Value>_>::vector
            ((vector<Value,_std::allocator<Value>_> *)&local_128,&args);
  Frame::Frame(this_03,(ClassInstance *)object.object,classRuntime,&local_f0,&local_110,
               (vector<Value,_std::allocator<Value>_> *)&local_128);
  std::_Vector_base<Value,_std::allocator<Value>_>::~_Vector_base(&local_128);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  pFVar9 = VMStack::getTopFrame(this_00);
  if (pFVar9 == this_01) {
    VMStack::addFrame(this_00,this_03);
  }
  else {
    std::deque<Value,_std::allocator<Value>_>::deque
              ((deque<Value,_std::allocator<Value>_> *)&local_d0,&operandStackBackup.c);
    Frame::setOperandStackFromBackup
              (this_01,(stack<Value,_std::deque<Value,_std::allocator<Value>_>_> *)&local_d0);
    std::_Deque_base<Value,_std::allocator<Value>_>::~_Deque_base(&local_d0);
    Frame::~Frame(this_03);
    operator_delete(this_03);
  }
  std::_Vector_base<Value,_std::allocator<Value>_>::~_Vector_base
            (&args.super__Vector_base<Value,_std::allocator<Value>_>);
  if (pFVar9 != this_01) goto LAB_00122211;
  goto LAB_0012220e;
}

Assistant:

void ExecutionEngine::i_invokespecial() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    
    stack<Value> operandStackBackup = topFrame->backupOperandStack();
    
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t methodIndex = (byte1 << 8) | byte2;
    cp_info methodCP = constantPool[methodIndex-1];
    assert(methodCP.tag == CONSTANT_Methodref); // precisa referenciar um método

    CONSTANT_Methodref_info methodInfo = methodCP.info.methodref_info;

    string className = getFormattedConstant(constantPool, methodInfo.class_index);

    cp_info nameAndTypeCP = constantPool[methodInfo.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info methodNameAndType = nameAndTypeCP.info.nameAndType_info;

    string methodName = getFormattedConstant(constantPool, methodNameAndType.name_index);
    string methodDescriptor = getFormattedConstant(constantPool, methodNameAndType.descriptor_index);
    
    // casos especiais
    if ((className == "java/lang/Object" || className == "java/lang/String") && methodName == "<init>") {
        if (className == "java/lang/String") {
            topFrame->popTopOfOperandStack();
        }
        
        topFrame->pc += 3;
        return;
    }
    // fim dos casos especiais
    
    if (className.find("java/") != string::npos) {
        cerr << "Tentando invocar metodo especial invalido: " << methodName << endl;
        exit(1);
    } else {
        uint16_t nargs = 0; // numero de argumentos contidos na pilha de operandos
        uint16_t i = 1; // pulando o primeiro '('
        while (methodDescriptor[i] != ')') {
            char baseType = methodDescriptor[i];
            if (baseType == 'D' || baseType == 'J') {
                nargs += 2;
            } else if (baseType == 'L') {
                nargs++;
                while (methodDescriptor[++i] != ';');
            } else if (baseType == '[') {
                nargs++;
                while (methodDescriptor[++i] == '[');
                if (methodDescriptor[i] == 'L') while (methodDescriptor[++i] != ';');
            } else {
                nargs++;
            }
            i++;
        }

        vector<Value> args;
        for (int i = 0; i < nargs; i++) {
            Value value = topFrame->popTopOfOperandStack();
            if (value.type == ValueType::PADDING) {
                args.insert(args.begin() + 1, value); // adicionando o padding após o valor double/long.
            } else {
                args.insert(args.begin(), value);
            }
        }

        Value objectValue = topFrame->popTopOfOperandStack();
        assert(objectValue.type == ValueType::REFERENCE); // necessita ser uma referência para objeto
        args.insert(args.begin(), objectValue);

        Object *object = objectValue.data.object;
        assert(object->objectType() == ObjectType::CLASS_INSTANCE); // objeto precisa ser uma instância
        ClassInstance *instance = (ClassInstance *) object;

        MethodArea &methodArea = MethodArea::getInstance();
        ClassRuntime *classRuntime = methodArea.loadClassNamed(className);
        
        Frame *newFrame = new Frame(instance, classRuntime, methodName, methodDescriptor, args);

        // se a stack frame mudou, é porque teve <clinit> adicionado, então terminar a execução da instrução para eles serem executados.
        if (stackFrame.getTopFrame() != topFrame) {
            topFrame->setOperandStackFromBackup(operandStackBackup);
            delete newFrame;
            return;
        }

        stackFrame.addFrame(newFrame);
    }

    topFrame->pc += 3;
}